

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

lys_module *
moveto_resolve_model
          (char *mod_name_ns,uint16_t mod_nam_ns_len,ly_ctx *ctx,lys_node *cur_snode,int is_name)

{
  byte bVar1;
  char *pcVar2;
  lys_import *plVar3;
  ulong __n;
  int iVar4;
  lys_module *plVar5;
  lys_module *plVar6;
  long lVar7;
  ushort uVar8;
  
  __n = (ulong)mod_nam_ns_len;
  if (cur_snode != (lys_node *)0x0) {
    bVar1 = (ctx->models).parsing_sub_modules_count;
    if ((bVar1 == 0) ||
       (plVar6 = (ctx->models).parsing_sub_modules[bVar1 - 1], cur_snode->module == plVar6)) {
      plVar6 = cur_snode->module;
    }
    plVar5 = lys_main_module(plVar6);
    pcVar2 = plVar5->name;
    iVar4 = strncmp(pcVar2,mod_name_ns,__n);
    if ((iVar4 == 0) && (pcVar2[__n] == '\0')) {
      return plVar5;
    }
    bVar1 = plVar6->imp_size;
    if ((ulong)bVar1 != 0) {
      plVar3 = plVar6->imp;
      lVar7 = 0;
      do {
        plVar6 = *(lys_module **)(plVar3->rev + lVar7 + -0x10);
        pcVar2 = plVar6->name;
        iVar4 = strncmp(pcVar2,mod_name_ns,__n);
        if ((iVar4 == 0) && (pcVar2[__n] == '\0')) {
          return plVar6;
        }
        lVar7 = lVar7 + 0x38;
      } while ((ulong)bVar1 * 0x38 - lVar7 != 0);
    }
  }
  iVar4 = (ctx->models).used;
  if (0 < iVar4) {
    uVar8 = 0;
    do {
      uVar8 = uVar8 + 1;
    } while ((int)(uint)uVar8 < iVar4);
  }
  return (lys_module *)0x0;
}

Assistant:

static struct lys_module *
moveto_resolve_model(const char *mod_name_ns, uint16_t mod_nam_ns_len, struct ly_ctx *ctx, struct lys_node *cur_snode,
                     int is_name)
{
    uint16_t i;
    const char *str;
    struct lys_module *mod, *mainmod;

    if (cur_snode) {
        /* detect if the XPath is used in augment - in such a case the module of the context node (cur_snode)
         * differs from the currently processed module. Then, we have to use the currently processed module
         * for searching for the module/namespace instead of the module of the context node */
        if (ctx->models.parsing_sub_modules_count &&
                cur_snode->module != ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1]) {
            mod = ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1];
        } else {
            mod = cur_snode->module;
        }
        mainmod = lys_main_module(mod);

        str = (is_name ? mainmod->name : mainmod->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return mainmod;
        }

        for (i = 0; i < mod->imp_size; ++i) {
            str = (is_name ? mod->imp[i].module->name : mod->imp[i].module->ns);
            if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
                return mod->imp[i].module;
            }
        }
    }

    for (i = 0; i < ctx->models.used; ++i) {
        if (!ctx->models.list[i]->implemented || ctx->models.list[i]->disabled) {
            /* skip not implemented or disabled modules */
            continue;
        }
        str = (is_name ? ctx->models.list[i]->name : ctx->models.list[i]->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return ctx->models.list[i];
        }
    }

    return NULL;
}